

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

bool diligent_spirv_cross::CompilerGLSL::needs_enclose_expression(string *expr)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  ulong uVar4;
  char *pcVar5;
  reference pcVar6;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_30;
  char c_1;
  const_iterator __end2;
  const_iterator __begin2;
  string *__range2;
  uint32_t paren_count;
  value_type c;
  bool need_parens;
  string *expr_local;
  
  bVar2 = false;
  uVar4 = ::std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    pcVar5 = (char *)::std::__cxx11::string::front();
    cVar1 = *pcVar5;
    if (((((cVar1 == '-') || (cVar1 == '+')) || (cVar1 == '!')) ||
        ((cVar1 == '~' || (cVar1 == '&')))) || (cVar1 == '*')) {
      bVar2 = true;
    }
  }
  if (bVar2 == false) {
    __range2._0_4_ = 0;
    __end2._M_current = (char *)::std::__cxx11::string::begin();
    _Stack_30._M_current = (char *)::std::__cxx11::string::end();
    while (bVar3 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffffd0), bVar3) {
      pcVar6 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&__end2);
      cVar1 = *pcVar6;
      if ((cVar1 == '(') || (cVar1 == '[')) {
        __range2._0_4_ = (int)__range2 + 1;
      }
      else if ((cVar1 == ')') || (cVar1 == ']')) {
        if ((int)__range2 == 0) {
          __assert_fail("paren_count",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Cross/spirv_glsl.cpp"
                        ,0x1401,
                        "static bool diligent_spirv_cross::CompilerGLSL::needs_enclose_expression(const std::string &)"
                       );
        }
        __range2._0_4_ = (int)__range2 + -1;
      }
      else if ((cVar1 == ' ') && ((int)__range2 == 0)) {
        bVar2 = true;
        break;
      }
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end2);
    }
    if ((int)__range2 != 0) {
      __assert_fail("paren_count == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Cross/spirv_glsl.cpp"
                    ,0x140a,
                    "static bool diligent_spirv_cross::CompilerGLSL::needs_enclose_expression(const std::string &)"
                   );
    }
  }
  return bVar2;
}

Assistant:

bool CompilerGLSL::needs_enclose_expression(const std::string &expr)
{
	bool need_parens = false;

	// If the expression starts with a unary we need to enclose to deal with cases where we have back-to-back
	// unary expressions.
	if (!expr.empty())
	{
		auto c = expr.front();
		if (c == '-' || c == '+' || c == '!' || c == '~' || c == '&' || c == '*')
			need_parens = true;
	}

	if (!need_parens)
	{
		uint32_t paren_count = 0;
		for (auto c : expr)
		{
			if (c == '(' || c == '[')
				paren_count++;
			else if (c == ')' || c == ']')
			{
				assert(paren_count);
				paren_count--;
			}
			else if (c == ' ' && paren_count == 0)
			{
				need_parens = true;
				break;
			}
		}
		assert(paren_count == 0);
	}

	return need_parens;
}